

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O3

void __thiscall banksia::WbEngine::tickWork(WbEngine *this)

{
  int iVar1;
  size_t in_RCX;
  void *__buf;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  Engine::tickWork((Engine *)this);
  if ((this->super_EngineProfile).super_Engine.super_Player.state == starting) {
    if (this->tick_delay_2_ready < 1) {
      if ((0x14 < (this->super_EngineProfile).super_Engine.super_Player.tick_state) &&
         ((this->super_EngineProfile).super_Engine.correctCmdCnt < 2)) {
        Player::setState((Player *)this,stopped);
        return;
      }
    }
    else {
      iVar1 = this->tick_delay_2_ready + -1;
      this->tick_delay_2_ready = iVar1;
      if (iVar1 == 0) {
        local_38[0] = local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"force","");
        Engine::write((Engine *)this,(int)local_38,__buf,in_RCX);
        if (local_38[0] != local_28) {
          operator_delete(local_38[0]);
        }
        if (this->feature_ping == true) {
          (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x1f])(this);
        }
        Player::setState((Player *)this,ready);
      }
    }
  }
  return;
}

Assistant:

void WbEngine::tickWork()
{
    EngineProfile::tickWork();

    if (getState() == PlayerState::starting) {
        if (tick_delay_2_ready > 0) {
            tick_delay_2_ready--;
            if (tick_delay_2_ready == 0) {
                write("force");
                if (feature_ping) {
                    sendPing();
                }
                setState(PlayerState::ready);
            }
        } else if (tick_state > 10 * 2 && correctCmdCnt < 2) {
            // crashed
            setState(PlayerState::stopped);
        }
    }
}